

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

void __thiscall GameBoard::eliminate(GameBoard *this,int color)

{
  bool bVar1;
  bool bVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  
  this->transCount[color] = 0;
  this->maxHeight[color] = 0x14;
  piVar3 = this->gridInfo[color][1] + 1;
  lVar4 = 1;
  do {
    lVar6 = 0;
    bVar2 = true;
    bVar1 = true;
    do {
      if (piVar3[lVar6] == 0) {
        bVar2 = false;
      }
      else {
        bVar1 = false;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 10);
    if (bVar2) {
      lVar6 = 0;
      do {
        this->trans[color][this->transCount[color]][lVar6 + 1] = (uint)(piVar3[lVar6] == 1);
        piVar3[lVar6] = 0;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 10);
      this->transCount[color] = this->transCount[color] + 1;
    }
    else {
      if (bVar1) {
        this->maxHeight[color] = (int)lVar4 + -1;
        break;
      }
      lVar6 = 0;
      do {
        iVar5 = piVar3[lVar6];
        if (0 < iVar5) {
          iVar5 = 1;
        }
        (piVar3 + lVar6)[(long)this->transCount[color] * -0xc] = iVar5;
        if (this->transCount[color] != 0) {
          piVar3[lVar6] = 0;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 10);
    }
    lVar4 = lVar4 + 1;
    piVar3 = piVar3 + 0xc;
  } while (lVar4 != 0x15);
  this->maxHeight[color] = this->maxHeight[color] - this->transCount[color];
  this->elimTotal[color] = this->elimTotal[color] + elimBonus[this->transCount[color]];
  return;
}

Assistant:

void GameBoard::eliminate(int color)
{
    int &count = transCount[color] = 0;
    int i, j, emptyFlag, fullFlag;
    maxHeight[color] = MAPHEIGHT;
    for (i = 1; i <= MAPHEIGHT; i++) {
        emptyFlag = 1;
        fullFlag = 1;
        for (j = 1; j <= MAPWIDTH; j++) {
            if (gridInfo[color][i][j] == 0)
                fullFlag = 0;
            else
                emptyFlag = 0;
        }
        if (fullFlag) {
            for (j = 1; j <= MAPWIDTH; j++) {
                // 注意这里只转移以前的块，不包括最后一次落下的块（“撤销最后一步”）
                trans[color][count][j] = gridInfo[color][i][j] == 1 ? 1 : 0;
                gridInfo[color][i][j] = 0;
            }
            count++;
        }
        else if (emptyFlag) {
            maxHeight[color] = i - 1;
            break;
        }
        else
            for (j = 1; j <= MAPWIDTH; j++) {
                gridInfo[color][i - count][j] =
                    gridInfo[color][i][j] > 0 ? 1 : gridInfo[color][i][j];
                if (count)
                    gridInfo[color][i][j] = 0;
            }
    }
    maxHeight[color] -= count;
    elimTotal[color] += elimBonus[count];
}